

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::
join<char_const*&,char_const(&)[29],char_const*&,char_const(&)[8],char_const*&,char_const(&)[34]>
          (spirv_cross *this,char **ts,char (*ts_1) [29],char **ts_2,char (*ts_3) [8],char **ts_4,
          char (*ts_5) [34])

{
  undefined1 local_1128 [8];
  StringStream<4096UL,_4096UL> stream;
  char **ts_local_4;
  char (*ts_local_3) [8];
  char **ts_local_2;
  char (*ts_local_1) [29];
  char **ts_local;
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_4;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  inner::
  join_helper<char_const*&,char_const(&)[29],char_const*&,char_const(&)[8],char_const*&,char_const(&)[34]>
            ((StringStream<4096UL,_4096UL> *)local_1128,ts,ts_1,ts_2,ts_3,
             (char **)stream.saved_buffers.stack_storage.aligned_char._184_8_,ts_5);
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  return this;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}